

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aTextureMipmapTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Accuracy::TextureMipmapTests::init(TextureMipmapTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  TestNode *pTVar2;
  TestNode *node;
  ulong extraout_RAX;
  TestNode *node_00;
  ostream *poVar3;
  Texture2DMipmapCase *this_00;
  RenderContext *pRVar4;
  ContextInfo *pCVar5;
  char *name_00;
  ulong uVar6;
  TextureCubeMipmapCase *this_01;
  int local_204;
  int minFilter_1;
  TestCaseGroup *coordTypeGroup_1;
  int coordType_1;
  int cubeMapSize;
  ostringstream local_1c8 [8];
  ostringstream name;
  int wrapMode;
  int minFilter;
  TestCaseGroup *coordTypeGroup;
  int coordType;
  int tex2DHeight;
  int tex2DWidth;
  TestCaseGroup *groupCube;
  TestCaseGroup *group2D;
  TextureMipmapTests *this_local;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d",
             "2D Texture Mipmapping");
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube",
             "Cube Map Filtering");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  tcu::TestNode::addChild((TestNode *)this,node);
  coordTypeGroup._4_4_ = 0;
  uVar6 = extraout_RAX;
  while ((int)coordTypeGroup._4_4_ < 3) {
    node_00 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node_00,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::coordTypes[(int)coordTypeGroup._4_4_].name,
               init::coordTypes[(int)coordTypeGroup._4_4_].desc);
    tcu::TestNode::addChild(pTVar2,node_00);
    for (name._372_4_ = 0; (int)name._372_4_ < 4; name._372_4_ = name._372_4_ + 1) {
      for (name._368_4_ = 0; (int)name._368_4_ < 3; name._368_4_ = name._368_4_ + 1) {
        std::__cxx11::ostringstream::ostringstream(local_1c8);
        poVar3 = std::operator<<((ostream *)local_1c8,init::minFilterModes[(int)name._372_4_].name);
        poVar3 = std::operator<<(poVar3,"_");
        std::operator<<(poVar3,init::wrapModes[(int)name._368_4_].name);
        this_00 = (Texture2DMipmapCase *)operator_new(0x100);
        pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
        pRVar4 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
        pCVar5 = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
        std::__cxx11::ostringstream::str();
        name_00 = (char *)std::__cxx11::string::c_str();
        Texture2DMipmapCase::Texture2DMipmapCase
                  (this_00,pTVar1,pRVar4,pCVar5,name_00,"",
                   init::coordTypes[(int)coordTypeGroup._4_4_].type,
                   init::minFilterModes[(int)name._372_4_].mode,
                   init::wrapModes[(int)name._368_4_].mode,init::wrapModes[(int)name._368_4_].mode,
                   0x1908,0x1401,0x40,0x40);
        tcu::TestNode::addChild(node_00,(TestNode *)this_00);
        std::__cxx11::string::~string((string *)&cubeMapSize);
        std::__cxx11::ostringstream::~ostringstream(local_1c8);
      }
    }
    coordTypeGroup._4_4_ = coordTypeGroup._4_4_ + 1;
    uVar6 = (ulong)coordTypeGroup._4_4_;
  }
  coordTypeGroup_1._4_4_ = 0;
  while ((int)coordTypeGroup_1._4_4_ < 2) {
    pTVar2 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar2,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::cubeCoordTypes[(int)coordTypeGroup_1._4_4_].name,
               init::cubeCoordTypes[(int)coordTypeGroup_1._4_4_].desc);
    tcu::TestNode::addChild(node,pTVar2);
    for (local_204 = 0; local_204 < 4; local_204 = local_204 + 1) {
      this_01 = (TextureCubeMipmapCase *)operator_new(0x100);
      pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
      pRVar4 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
      pCVar5 = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
      TextureCubeMipmapCase::TextureCubeMipmapCase
                (this_01,pTVar1,pRVar4,pCVar5,init::minFilterModes[local_204].name,"",
                 init::cubeCoordTypes[(int)coordTypeGroup_1._4_4_].type,
                 init::minFilterModes[local_204].mode,0x812f,0x812f,0x1908,0x1401,0x40);
      tcu::TestNode::addChild(pTVar2,(TestNode *)this_01);
    }
    coordTypeGroup_1._4_4_ = coordTypeGroup_1._4_4_ + 1;
    uVar6 = (ulong)coordTypeGroup_1._4_4_;
  }
  return (int)uVar6;
}

Assistant:

void TextureMipmapTests::init (void)
{
	tcu::TestCaseGroup* group2D		= new tcu::TestCaseGroup(m_testCtx, "2d",	"2D Texture Mipmapping");
	tcu::TestCaseGroup*	groupCube	= new tcu::TestCaseGroup(m_testCtx, "cube",	"Cube Map Filtering");
	addChild(group2D);
	addChild(groupCube);

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE },
		{ "repeat",		GL_REPEAT },
		{ "mirror",		GL_MIRRORED_REPEAT }
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} minFilterModes[] =
	{
		{ "nearest_nearest",	GL_NEAREST_MIPMAP_NEAREST	},
		{ "linear_nearest",		GL_LINEAR_MIPMAP_NEAREST	},
		{ "nearest_linear",		GL_NEAREST_MIPMAP_LINEAR	},
		{ "linear_linear",		GL_LINEAR_MIPMAP_LINEAR		}
	};

	static const struct
	{
		CoordType		type;
		const char*		name;
		const char*		desc;
	} coordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_AFFINE,		"affine",		"Mipmapping with affine coordinate transform"		},
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			}
	};

	const int tex2DWidth	= 64;
	const int tex2DHeight	= 64;

	// 2D cases.
	for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(coordTypes); coordType++)
	{
		tcu::TestCaseGroup* coordTypeGroup = new tcu::TestCaseGroup(m_testCtx, coordTypes[coordType].name, coordTypes[coordType].desc);
		group2D->addChild(coordTypeGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
		{
			for (int wrapMode = 0; wrapMode < DE_LENGTH_OF_ARRAY(wrapModes); wrapMode++)
			{
				std::ostringstream name;
				name << minFilterModes[minFilter].name
						<< "_" << wrapModes[wrapMode].name;

				coordTypeGroup->addChild(new Texture2DMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
																	name.str().c_str(), "",
																	coordTypes[coordType].type,
																	minFilterModes[minFilter].mode,
																	wrapModes[wrapMode].mode,
																	wrapModes[wrapMode].mode,
																	GL_RGBA, GL_UNSIGNED_BYTE,
																	tex2DWidth, tex2DHeight));
			}
		}
	}

	const int cubeMapSize = 64;

	static const struct
	{
		CoordType		type;
		const char*		name;
		const char*		desc;
	} cubeCoordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			}
	};

	// Cubemap cases.
	for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(cubeCoordTypes); coordType++)
	{
		tcu::TestCaseGroup* coordTypeGroup = new tcu::TestCaseGroup(m_testCtx, cubeCoordTypes[coordType].name, cubeCoordTypes[coordType].desc);
		groupCube->addChild(coordTypeGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
		{
			coordTypeGroup->addChild(new TextureCubeMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
															   minFilterModes[minFilter].name, "",
															   cubeCoordTypes[coordType].type,
															   minFilterModes[minFilter].mode,
															   GL_CLAMP_TO_EDGE,
															   GL_CLAMP_TO_EDGE,
															   GL_RGBA, GL_UNSIGNED_BYTE, cubeMapSize));
		}
	}
}